

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_common.c
# Opt level: O3

int dfft_create_execution_flow(dfft_plan *plan)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int *piVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  int iVar16;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  iVar1 = plan->ndim;
  lVar13 = (long)iVar1;
  piVar8 = (int *)malloc(lVar13 * 4);
  plan->depth = piVar8;
  plan->max_depth = 0;
  if (0 < lVar13) {
    piVar2 = plan->gdim;
    piVar3 = plan->pdim;
    lVar11 = 0;
    uVar14 = 0;
    do {
      iVar16 = piVar3[lVar11];
      iVar7 = piVar2[lVar11] / iVar16;
      uVar10 = 0;
      if (1 < iVar7) {
        iVar12 = plan->k0[lVar11];
        uVar10 = 0;
        if (iVar12 <= iVar16) {
          uVar10 = 0;
          do {
            uVar10 = uVar10 + 1;
            iVar12 = iVar12 * iVar7;
          } while (iVar12 <= iVar16);
        }
      }
      piVar8[lVar11] = uVar10;
      if ((int)uVar14 < (int)uVar10) {
        plan->max_depth = uVar10;
        uVar14 = uVar10;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar13);
    if (uVar14 != 0) {
      piVar8 = (int *)malloc((long)(int)uVar14 << 2);
      plan->n_fft = piVar8;
      auVar6 = _DAT_00104020;
      auVar5 = _DAT_00104010;
      auVar4 = _DAT_00104000;
      if (0 < (int)uVar14) {
        lVar13 = (ulong)uVar14 - 1;
        auVar15._8_4_ = (int)lVar13;
        auVar15._0_8_ = lVar13;
        auVar15._12_4_ = (int)((ulong)lVar13 >> 0x20);
        piVar8 = plan->n_fft + ((ulong)uVar14 - 1);
        uVar9 = 0;
        auVar15 = auVar15 ^ _DAT_00104020;
        do {
          auVar17._8_4_ = (int)uVar9;
          auVar17._0_8_ = uVar9;
          auVar17._12_4_ = (int)(uVar9 >> 0x20);
          auVar18 = (auVar17 | auVar5) ^ auVar6;
          iVar16 = auVar15._4_4_;
          if ((bool)(~(auVar18._4_4_ == iVar16 && auVar15._0_4_ < auVar18._0_4_ ||
                      iVar16 < auVar18._4_4_) & 1)) {
            *piVar8 = iVar1;
          }
          if ((auVar18._12_4_ != auVar15._12_4_ || auVar18._8_4_ <= auVar15._8_4_) &&
              auVar18._12_4_ <= auVar15._12_4_) {
            piVar8[-1] = iVar1;
          }
          auVar17 = (auVar17 | auVar4) ^ auVar6;
          iVar7 = auVar17._4_4_;
          if (iVar7 <= iVar16 && (iVar7 != iVar16 || auVar17._0_4_ <= auVar15._0_4_)) {
            piVar8[-2] = iVar1;
            piVar8[-3] = iVar1;
          }
          uVar9 = uVar9 + 4;
          piVar8 = piVar8 + -4;
        } while ((uVar14 + 3 & 0xfffffffc) != uVar9);
      }
    }
  }
  plan->final_multi = 0;
  return 0;
}

Assistant:

int dfft_create_execution_flow(dfft_plan *plan)
    {
    /* compute depth of parallel fft (number of redistributions/dimension) */
    plan->depth = malloc(sizeof(int)*plan->ndim);
    plan->max_depth = 0;
    int i,d,j;
    for (i=0; i< plan->ndim; ++i)
        {
        d = 0;
        int p = plan->pdim[i];
        int l = plan->gdim[i]/p;
        if (l > 1)
            {
            for (j = plan->k0[i]; j <= p; j*=l)
                d++;
            }
        plan->depth[i] = d;
        if (d > plan->max_depth) plan->max_depth = d;
        }

    if (plan->max_depth)
        plan->n_fft = (int *)malloc(sizeof(int)*plan->max_depth);

    /* we always decompose into 1d FFTs when the backend doesn't support
     * multidimensional */
    int decompose_1d = 1 ;
    #ifdef ENABLE_CUDA
    if (plan->device)
        {
        #ifdef CUDA_FFT_SUPPORTS_MULTI
        decompose_1d = ((plan->ndim > CUDA_FFT_MAX_N) ? 1 : 0);
        #else
        decompose_1d = 1;
        #endif

        }
    else
    #endif
        {
        #ifdef HOST_FFT_SUPPORTS_MULTI
        decompose_1d = 0;
        #else
        decompose_1d = 1;
        #endif
        }

    /* allocate plans */
    #ifdef ENABLE_CUDA
    if (plan->device)
        {
        if (plan->max_depth)
            {
            plan->cuda_plans_multi_fw =
                (cuda_plan_t **)malloc(sizeof(cuda_plan_t *)*plan->max_depth);
            plan->cuda_plans_multi_bw =
                (cuda_plan_t **)malloc(sizeof(cuda_plan_t *)*plan->max_depth);
           }
        }
    #endif

    /* now create plans for every level, except the lowest */
    /* this is a general 'vector-radix' implementation */
    for (d = plan->max_depth-1; d >= 0; d--)
        {
        /* count number of ffts at this level in all dimensions */
        int n = 0;
        for (i = 0; i < plan->ndim; ++i)
            if (plan->depth[i] > d) n++;

        if (n < plan->ndim || decompose_1d)
            {
            /* 1D FFT for all 'active' dimensions, transposing as we go */
            plan->n_fft[d] = plan->ndim;

            /* allocate ndim plans */
            #ifdef ENABLE_CUDA
            if (plan->device)
                {
                plan->cuda_plans_multi_fw[d] =
                    (cuda_plan_t *)malloc(sizeof(cuda_plan_t)*plan->ndim);
                plan->cuda_plans_multi_bw[d] =
                    (cuda_plan_t *)malloc(sizeof(cuda_plan_t)*plan->ndim);
                }
            #endif

            for (i = 0; i< plan->ndim; ++i)
                {
                int istride = plan->size_in/plan->inembed[i];
                int ostride = 1;
                int idist = 1;
                int odist = plan->inembed[i];
                int howmany = plan->size_in/plan->inembed[i];

                /* if at this level, there is no planned FFT along the current
                 * dimension, just proceed  */
                int dim;
                if (plan->depth[i] > d)
                    {
                    dim = plan->gdim[i]/plan->pdim[i];

                    #ifdef ENABLE_CUDA
                    if (plan->device)
                        {
                        int res;
                        res = dfft_cuda_create_1d_plan(&plan->cuda_plans_multi_fw[d][i],
                            dim, howmany, istride, idist, ostride, odist, 0);
                        CHECK_PLAN_CREATE(res);
                        res = dfft_cuda_create_1d_plan(&plan->cuda_plans_multi_bw[d][i],
                            dim, howmany, istride, idist, ostride, odist, 1);
                        CHECK_PLAN_CREATE(res);
                        }
                    #endif
                    }
                }
            }
        else
            {
            /* all dimensions have equal length, use multidimensinoal FFT */
            plan->n_fft[d] = 1;

            /* allocate plan */
            #ifdef ENABLE_CUDA
            if (plan->device)
                {
                plan->cuda_plans_multi_fw[d] =
                    (cuda_plan_t *)malloc(sizeof(cuda_plan_t));
                plan->cuda_plans_multi_bw[d] =
                    (cuda_plan_t *)malloc(sizeof(cuda_plan_t));
                }
            #endif

            int *dim = malloc(sizeof(int)*plan->ndim);
            for (i = 0; i < plan->ndim; ++i)
                dim[i] = plan->gdim[i]/plan->pdim[i];

            int howmany = 1;
            /* create multidimensional forward and backward plans */
            #ifdef ENABLE_CUDA
            if (plan->device)
                {
                int res;
                res = dfft_cuda_create_nd_plan(&plan->cuda_plans_multi_fw[d][0],
                    plan->ndim, dim, howmany,
                    plan->inembed, 1, 1, plan->inembed, 1, 1, 0);
                CHECK_PLAN_CREATE(res);
                res = dfft_cuda_create_nd_plan(&plan->cuda_plans_multi_bw[d][0],
                    plan->ndim, dim, howmany,
                    plan->inembed, 1, 1, plan->inembed, 1, 1, 1);
                CHECK_PLAN_CREATE(res);
                }
            #endif
            free(dim);
            }
        } /* end loop over levels */

    /* create plans for final stage */
    plan->final_multi = 1;
    if (decompose_1d)
        {
        plan->final_multi = 0;
        }
    else
        {
        /* find out if we are doing a full FFT in every dimension */
        for (i = 0; i < plan->ndim; ++i)
            if (! (plan->k0[i] == plan->gdim[i]/plan->pdim[i]))
                {
                plan->final_multi = 0;
                break;
                }
        }

    if (!plan->final_multi)
        {
        /* again, we proceed by doing partial 1d FFTs dimension-wise,
         * in between we have to transpose */

        /* allocate plans */
        #ifdef ENABLE_CUDA
        if (plan->device)
            {
            plan->cuda_plans_final_fw =
                (cuda_plan_t *)malloc(sizeof(cuda_plan_t)*plan->ndim);
            plan->cuda_plans_final_bw =
                (cuda_plan_t *)malloc(sizeof(cuda_plan_t)*plan->ndim);
            }
        #endif

        int size = plan->size_in;
        for (i = 0; i < plan->ndim; ++i)
            {
            int s = size/plan->inembed[i] *(plan->gdim[i]/plan->pdim[i]);
            int dim = plan->k0[i];
            int howmany = s/(plan->k0[i]);
            int istride = s/(plan->k0[i]);
            int idist = 1;
            int ostride = s/(plan->k0[i]);
            int odist = 1;

            #ifdef ENABLE_CUDA
            int res;
            res = dfft_cuda_create_1d_plan(&plan->cuda_plans_final_fw[i],
                dim, howmany, istride, idist, ostride, odist, 0);
            CHECK_PLAN_CREATE(res);
            res = dfft_cuda_create_1d_plan(&plan->cuda_plans_final_bw[i],
                dim, howmany, istride, idist, ostride, odist, 1);
            CHECK_PLAN_CREATE(res);
            #endif

            /* this time, we change to the output embedding */
            size /= plan->inembed[i];
            size *= plan->oembed[i];
            }
        }
    else
        {
        /* the final stage is a multidimensional transform */
        /* allocate plan */
        #ifdef ENABLE_CUDA
        if (plan->device)
            {
            plan->cuda_plans_final_fw =
                (cuda_plan_t *)malloc(sizeof(cuda_plan_t));
            plan->cuda_plans_final_bw =
                (cuda_plan_t *)malloc(sizeof(cuda_plan_t));
            }
        #endif

        int *dim = malloc(sizeof(int)*plan->ndim);
        for (i = 0; i < plan->ndim; ++i)
            dim[i] = plan->gdim[i]/plan->pdim[i];

        int howmany = 1;
        /* create multidimensional forward and backward plans */
        #ifdef ENABLE_CUDA
        if (plan->device)
            {
            int res;
            res = dfft_cuda_create_nd_plan(&plan->cuda_plans_final_fw[0],
                plan->ndim, dim, howmany,
                plan->inembed, 1, 1, plan->oembed, 1, 1, 0);
            CHECK_PLAN_CREATE(res);
            res = dfft_cuda_create_nd_plan(&plan->cuda_plans_final_bw[0],
                plan->ndim, dim, howmany,
                plan->inembed, 1, 1, plan->oembed, 1, 1, 1);
            CHECK_PLAN_CREATE(res);
            }
        #endif
        free(dim);
        }
    return 0;
    }